

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O2

void deductible_over_max(LossRec *x,OASIS_FLOAT max_ded)

{
  float fVar1;
  float fVar2;
  OASIS_FLOAT OVar3;
  float fVar4;
  
  fVar1 = x->loss;
  fVar4 = x->effective_deductible - max_ded;
  fVar2 = x->under_limit;
  if (fVar4 <= fVar2) {
    if (-fVar4 <= fVar1) {
      OVar3 = fVar1 + fVar4;
      x->under_limit = fVar2 - fVar4;
      x->effective_deductible = max_ded;
    }
    else {
      x->effective_deductible = x->effective_deductible + fVar1;
      x->under_limit = fVar2 + fVar1;
      OVar3 = 0.0;
    }
  }
  else {
    OVar3 = fVar1 + fVar2;
    x->over_limit = (fVar4 - fVar2) + x->over_limit;
    x->effective_deductible = max_ded;
    x->under_limit = 0.0;
  }
  x->loss = OVar3;
  return;
}

Assistant:

void deductible_over_max(LossRec& x,OASIS_FLOAT max_ded)
	{ //If effective deductible is more than the maximum, deductible will be reduced to the maximum
		OASIS_FLOAT loss_delta;
		OASIS_FLOAT loss;
		loss_delta = 0;
		loss = 0;
		loss_delta = x.effective_deductible - max_ded; // loss to increase by the loss_delta	
		if (loss_delta > x.under_limit) { // if loss increase is limited	
			loss = x.loss + x.under_limit; // increase loss by the underlimit
			x.over_limit = x.over_limit + (loss_delta - x.under_limit); //update the overlimit
			x.effective_deductible = max_ded; //update the deductible to carry forward
			x.under_limit = 0; //update the underlimit
		}
		else if (x.loss >= -loss_delta) {
			loss = x.loss + loss_delta; // else increase by the full loss delta	
			x.under_limit = x.under_limit - loss_delta; //update the underlimit	
			x.effective_deductible = max_ded;
		}
		else {
			loss = 0;
			x.effective_deductible = x.effective_deductible + x.loss;
			x.under_limit = x.under_limit + x.loss;
		}
		x.loss = loss;
}